

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::NamedBase::~NamedBase(NamedBase *this)

{
  ~NamedBase(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~NamedBase() {}